

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop.cc
# Opt level: O2

void __thiscall verona::track::pre_block(track *this,Node *block)

{
  pointer psVar1;
  mapped_type *pmVar2;
  vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  *pvVar3;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
  *p_Var4;
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
  *this_01;
  shared_ptr<trieste::NodeDef> *child;
  pointer psVar5;
  value_type parent;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->llvm == false) {
    psVar5 = (this->stack).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack).
        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar5) {
      p_Var4 = &::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,block)->_M_t;
      ::std::
      _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
      ::operator=(p_Var4,&(this->params)._M_t);
    }
    else {
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &psVar5[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
      pmVar2 = ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
               ::operator[](&this->children,(key_type *)&local_40);
      psVar1 = (pmVar2->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar5 = (pmVar2->
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1;
          psVar5 = psVar5 + 1) {
        if (((psVar5->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            parent_ !=
            ((block->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            parent_) {
          pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    *)::std::
                      map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                      ::operator[](&this->successors,psVar5);
          ::std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::push_back(pvVar3,block);
        }
      }
      pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                *)::std::
                  map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                  ::operator[](&this->children,(key_type *)&local_40);
      ::std::
      vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::push_back(pvVar3,block);
      this_00 = &::std::
                 map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                 ::operator[](&this->parents,block)->
                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&local_40);
      p_Var4 = &::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,(key_type *)&local_40)->_M_t;
      this_01 = &::std::
                 map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                 ::operator[](&this->lets,block)->_M_t;
      ::std::
      _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
      ::operator=(this_01,p_Var4);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               *)&this->stack,block);
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               *)this,block);
  }
  return;
}

Assistant:

void pre_block(Node block)
    {
      if (llvm)
        return;

      if (stack.empty())
      {
        lets[block] = params;
      }
      else
      {
        auto parent = stack.back();

        for (auto& child : children[parent])
        {
          // The new child is a successor of the old children unless it's a
          // sibling block in a conditional.
          if (child->parent() != block->parent())
            successors[child].push_back(block);
        }

        children[parent].push_back(block);
        parents[block] = parent;
        lets[block] = lets[parent];
      }

      stack.push_back(block);
      blocks.push_back(block);
    }